

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O2

bool libwebm::vttdemux::WriteFiles(metadata_map_t *m,Segment *s)

{
  bool bVar1;
  Cluster *this;
  
  InitializeFiles(m);
  bVar1 = WriteChaptersFile(m,s);
  if (bVar1) {
    for (this = mkvparser::Segment::GetFirst(s); bVar1 = true, this != (Cluster *)0x0;
        this = mkvparser::Segment::GetNext(s,this)) {
      bVar1 = mkvparser::Cluster::EOS(this);
      if (bVar1) {
        return true;
      }
      bVar1 = ProcessCluster(m,this);
      if (!bVar1) goto LAB_0010f703;
    }
  }
  else {
LAB_0010f703:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool vttdemux::WriteFiles(const metadata_map_t& m, mkvparser::Segment* s) {
  // First write the WebVTT header.

  InitializeFiles(m);

  if (!WriteChaptersFile(m, s))
    return false;

  // Now iterate over the clusters, writing the WebVTT cue as we parse
  // each metadata block.

  const mkvparser::Cluster* cluster = s->GetFirst();

  while (cluster != NULL && !cluster->EOS()) {
    if (!ProcessCluster(m, cluster))
      return false;

    cluster = s->GetNext(cluster);
  }

  return true;
}